

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_Message(FParser *this)

{
  AActor *this_00;
  bool bVar1;
  char *in_RAX;
  FString local_18;
  
  if (0 < this->t_argc) {
    this_00 = (this->Script->trigger).field_0.p;
    if (this_00 != (AActor *)0x0) {
      if (((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        local_18.Chars = in_RAX;
        bVar1 = AActor::CheckLocalView(this_00,consoleplayer);
        if (bVar1) {
          GetFormatString((FParser *)&stack0xffffffffffffffe8,(int)this);
          Printf(2,"%s\n",local_18.Chars);
          FString::~FString(&stack0xffffffffffffffe8);
        }
      }
      else {
        (this->Script->trigger).field_0.p = (AActor *)0x0;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_Message(void)
{
	if (t_argc>0 && Script->trigger &&
		Script->trigger->CheckLocalView(consoleplayer))
	{
		Printf(PRINT_HIGH, "%s\n", GetFormatString(0).GetChars());
	}
}